

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

spv_result_t
spvOpcodeTableNameLookup
          (spv_target_env env,spv_opcode_table table,char *name,spv_opcode_desc *pEntry)

{
  spv_opcode_desc psVar1;
  uint uVar2;
  uint uVar3;
  spv_opcode_desc_t *psVar4;
  char *pcVar5;
  char **ppcVar6;
  spv_result_t sVar7;
  uint32_t uVar8;
  int iVar9;
  size_t __n;
  size_t sVar10;
  ulong uVar11;
  uint32_t aliasIndex;
  ulong uVar12;
  
  sVar7 = SPV_ERROR_INVALID_POINTER;
  if (pEntry != (spv_opcode_desc *)0x0 && name != (char *)0x0) {
    if (table == (spv_opcode_table)0x0) {
      sVar7 = SPV_ERROR_INVALID_TABLE;
    }
    else {
      __n = strlen(name);
      uVar8 = spvVersionForTargetEnv(env);
      uVar2 = table->count;
      sVar7 = SPV_ERROR_INVALID_LOOKUP;
      if ((ulong)uVar2 != 0) {
        psVar4 = table->entries;
        uVar11 = 0;
        do {
          psVar1 = psVar4 + uVar11;
          if ((((psVar4[uVar11].minVersion <= uVar8) && (uVar8 <= psVar1->lastVersion)) ||
              (psVar1->numExtensions != 0)) || (psVar1->numCapabilities != 0)) {
            pcVar5 = psVar1->name;
            sVar10 = strlen(pcVar5);
            if ((__n == sVar10) && (iVar9 = strncmp(name,pcVar5,__n), iVar9 == 0)) {
LAB_005f0c88:
              *pEntry = psVar1;
              return SPV_SUCCESS;
            }
            uVar3 = psVar1->numAliases;
            if ((ulong)uVar3 != 0) {
              ppcVar6 = psVar1->aliases;
              uVar12 = 0;
              do {
                pcVar5 = ppcVar6[uVar12];
                sVar10 = strlen(pcVar5 + 2);
                if ((__n == sVar10) && (iVar9 = strncmp(name,pcVar5 + 2,__n), iVar9 == 0))
                goto LAB_005f0c88;
                uVar12 = uVar12 + 1;
              } while (uVar3 != uVar12);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar2);
        sVar7 = SPV_ERROR_INVALID_LOOKUP;
      }
    }
  }
  return sVar7;
}

Assistant:

spv_result_t spvOpcodeTableNameLookup(spv_target_env env,
                                      const spv_opcode_table table,
                                      const char* name,
                                      spv_opcode_desc* pEntry) {
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;
  if (!table) return SPV_ERROR_INVALID_TABLE;

  // TODO: This lookup of the Opcode table is suboptimal! Binary sort would be
  // preferable but the table requires sorting on the Opcode name, but it's
  // static const initialized and matches the order of the spec.
  const size_t nameLength = strlen(name);
  const auto version = spvVersionForTargetEnv(env);
  for (uint64_t opcodeIndex = 0; opcodeIndex < table->count; ++opcodeIndex) {
    const spv_opcode_desc_t& entry = table->entries[opcodeIndex];
    // We consider the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if ((version >= entry.minVersion && version <= entry.lastVersion) ||
        entry.numExtensions > 0u || entry.numCapabilities > 0u) {
      // Exact match case.
      if (nameLength == strlen(entry.name) &&
          !strncmp(name, entry.name, nameLength)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
      // Lack of binary search really hurts here. There isn't an easy filter to
      // apply before checking aliases since we need to handle promotion from
      // vendor to KHR/EXT and KHR/EXT to core. It would require a sure-fire way
      // of dropping suffices. Fortunately, most lookup are based on token
      // value.
      //
      // If this was a binary search we could iterate between the lower and
      // upper bounds.
      if (entry.numAliases > 0) {
        for (uint32_t aliasIndex = 0; aliasIndex < entry.numAliases;
             aliasIndex++) {
          // Skip Op prefix. Should this be encoded in the table instead?
          const auto alias = entry.aliases[aliasIndex] + 2;
          const size_t aliasLength = strlen(alias);
          if (nameLength == aliasLength && !strncmp(name, alias, nameLength)) {
            *pEntry = &entry;
            return SPV_SUCCESS;
          }
        }
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}